

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator
duckdb_fmt::v6::internal::write_exponent<char,duckdb_fmt::v6::internal::counting_iterator>
          (int exp,counting_iterator it)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = -exp;
  if (0 < exp) {
    uVar2 = exp;
  }
  lVar1 = it.count_ + 2;
  if (uVar2 < 1000) {
    lVar1 = it.count_ + 1;
  }
  lVar1 = lVar1 + 1;
  if (uVar2 < 100) {
    lVar1 = it.count_ + 1;
  }
  return (counting_iterator)(lVar1 + 2);
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}